

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

char * o_xtra_prompt(wchar_t oid)

{
  object_kind *poVar1;
  char *local_40;
  char *local_38;
  char *with_insc;
  char *no_insc;
  object_kind *kind;
  char *pcStack_10;
  wchar_t oid_local;
  
  poVar1 = objkind_byid(oid);
  if (poVar1 == (object_kind *)0x0) {
    pcStack_10 = (char *)0x0;
  }
  else if ((poVar1->aware & 1U) == 0) {
    if (poVar1->note_unaware == 0) {
      local_40 = ", \'s\' to toggle ignore, \'r\'ecall, \'{\'";
    }
    else {
      local_40 = ", \'s\' to toggle ignore, \'r\'ecall, \'{\', \'}\'";
    }
    pcStack_10 = local_40;
  }
  else {
    if (poVar1->note_aware == 0) {
      local_38 = ", \'s\' to toggle ignore, \'r\'ecall, \'{\'";
    }
    else {
      local_38 = ", \'s\' to toggle ignore, \'r\'ecall, \'{\', \'}\'";
    }
    pcStack_10 = local_38;
  }
  return pcStack_10;
}

Assistant:

static const char *o_xtra_prompt(int oid)
{
	struct object_kind *kind = objkind_byid(oid);

	const char *no_insc = ", 's' to toggle ignore, 'r'ecall, '{'";
	const char *with_insc = ", 's' to toggle ignore, 'r'ecall, '{', '}'";

	if (!kind) return NULL;

	/* Appropriate prompt */
	if (kind->aware)
		return kind->note_aware ? with_insc : no_insc;
	else
		return kind->note_unaware ? with_insc : no_insc;
}